

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

int lyxml_print_fd(int fd,lyxml_elem *elem,int options)

{
  undefined1 local_60 [8];
  lyout out;
  int options_local;
  lyxml_elem *elem_local;
  int fd_local;
  
  if ((fd < 0) || (elem == (lyxml_elem *)0x0)) {
    elem_local._4_4_ = 0;
  }
  else {
    out.hole_count._4_4_ = options;
    memset(local_60,0,0x40);
    local_60._0_4_ = LYOUT_FD;
    out.type = fd;
    if ((out.hole_count._4_4_ & 0x10) == 0) {
      elem_local._4_4_ = dump_elem((lyout *)local_60,elem,0,out.hole_count._4_4_,1);
    }
    else {
      elem_local._4_4_ = dump_siblings((lyout *)local_60,elem,out.hole_count._4_4_);
    }
  }
  return elem_local._4_4_;
}

Assistant:

API int
lyxml_print_fd(int fd, const struct lyxml_elem *elem, int options)
{
    struct lyout out;

    if (fd < 0 || !elem) {
        return 0;
    }

    memset(&out, 0, sizeof out);

    out.type = LYOUT_FD;
    out.method.fd = fd;

    if (options & LYXML_PRINT_SIBLINGS) {
        return dump_siblings(&out, elem, options);
    } else {
        return dump_elem(&out, elem, 0, options, 1);
    }
}